

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

void duckdb_destroy_arrow_stream(duckdb_arrow_stream *stream_p)

{
  duckdb_arrow_stream p_Var1;
  
  p_Var1 = *stream_p;
  if (p_Var1 != (duckdb_arrow_stream)0x0) {
    if (*(code **)(p_Var1 + 0x18) != (code *)0x0) {
      (**(code **)(p_Var1 + 0x18))(p_Var1);
    }
    operator_delete(p_Var1);
    *stream_p = (duckdb_arrow_stream)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_arrow_stream(duckdb_arrow_stream *stream_p) {

	auto stream = reinterpret_cast<ArrowArrayStream *>(*stream_p);
	if (!stream) {
		return;
	}
	if (stream->release) {
		stream->release(stream);
	}
	D_ASSERT(!stream->release);

	delete stream;
	*stream_p = nullptr;
}